

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::InnerProduct_x86_avx::create_pipeline_fp16s(InnerProduct_x86_avx *this,Option *opt)

{
  int num_output;
  int iVar1;
  _func_int *p_Var2;
  int *piVar3;
  int iVar4;
  
  p_Var2 = this->_vptr_InnerProduct_x86_avx[-3];
  num_output = *(int *)(&this->field_0xd0 + (long)p_Var2);
  iVar1 = *(int *)(&this->field_0xd8 + (long)p_Var2);
  iVar4 = cpu_support_x86_f16c();
  if (iVar4 != 0) {
    innerproduct_transform_kernel_fp16s_sse_f16c
              ((Mat *)(&this->field_0x130 + (long)p_Var2),&this->weight_data_tm,iVar1 / num_output,
               num_output,opt);
  }
  if (opt->lightmode == true) {
    p_Var2 = this->_vptr_InnerProduct_x86_avx[-3];
    piVar3 = *(int **)(&this->field_0x138 + (long)p_Var2);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (*(long **)(&this->field_0x150 + (long)p_Var2) == (long *)0x0) {
          if (*(void **)(&this->field_0x130 + (long)p_Var2) != (void *)0x0) {
            free(*(void **)(&this->field_0x130 + (long)p_Var2));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x150 + (long)p_Var2) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x170 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x13c + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x144 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x130 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x138 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x158 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x160 + (long)p_Var2) = 0;
    *(undefined4 *)(&this->field_0x168 + (long)p_Var2) = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_avx::create_pipeline_fp16s(const Option& opt)
{
    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_fp16s_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}